

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_resample.c
# Opt level: O2

t_int * upsampling_perform_hold(t_int *w)

{
  long lVar1;
  t_int tVar2;
  long lVar3;
  long lVar4;
  undefined4 *puVar5;
  undefined4 *puVar6;
  long lVar7;
  bool bVar8;
  
  lVar1 = w[1];
  lVar3 = (long)(int)w[3];
  tVar2 = w[4];
  puVar5 = (undefined4 *)(w[2] + lVar3 * 4);
  lVar4 = lVar3;
  while( true ) {
    puVar5 = puVar5 + -1;
    bVar8 = lVar4 == 0;
    lVar4 = lVar4 + -1;
    if (bVar8) break;
    puVar6 = puVar5;
    for (lVar7 = 0; (int)tVar2 != (int)lVar7; lVar7 = lVar7 + 1) {
      *puVar6 = *(undefined4 *)(lVar1 + lVar7 * 4);
      puVar6 = puVar6 + lVar3;
    }
  }
  return w + 5;
}

Assistant:

t_int *upsampling_perform_hold(t_int *w)
{
  t_sample *in  = (t_sample *)(w[1]); /* original signal     */
  t_sample *out = (t_sample *)(w[2]); /* upsampled signal    */
  int up       = (int)(w[3]);       /* upsampling factor   */
  int parent   = (int)(w[4]);       /* original vectorsize */
  int i=up;

  int n=parent;
  t_sample *dum_out = out;
  t_sample *dum_in  = in;

  while (i--) {
    n = parent;
    out = dum_out+i;
    in  = dum_in;
    while(n--){
      *out=*in++;
      out+=up;
    }
  }
  return (w+5);
}